

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.h
# Opt level: O1

string * __thiscall
wallet::BerkeleyRODatabase::Filename_abi_cxx11_
          (string *__return_storage_ptr__,BerkeleyRODatabase *this)

{
  long lVar1;
  pointer pcVar2;
  size_type sVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = (this->m_filepath).super_path._M_pathname._M_dataplus._M_p;
  sVar3 = (this->m_filepath).super_path._M_pathname._M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__cxx11::string::_M_construct<char_const*>();
    return __return_storage_ptr__;
  }
  __stack_chk_fail(__return_storage_ptr__,pcVar2,pcVar2 + sVar3);
}

Assistant:

std::string Filename() override { return fs::PathToString(m_filepath); }